

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_637b3::GeneratedCode_DeepCloneMessageMapField_Test::TestBody
          (GeneratedCode_DeepCloneMessageMapField_Test *this)

{
  upb_StringView a;
  upb_StringView a_00;
  upb_StringView a_01;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  upb_Arena *arena_00;
  char *pcVar3;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *msg_00;
  char *in_R9;
  upb_Arena *expected_predicate_value;
  AssertHelper local_758;
  Message local_750;
  int32_t local_744;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_8;
  Message local_728;
  void *local_720;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_6e8;
  Message local_6e0;
  upb_StringView local_6d8;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *local_6c8;
  char *local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_680;
  Message local_678;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__14;
  size_t iter_4;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *value_4;
  upb_StringView key_4;
  AssertHelper local_618;
  Message local_610;
  upb_StringView local_608;
  char *local_5f8;
  char *local_5f0;
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5b0;
  Message local_5a8;
  upb_StringView local_5a0;
  char *local_590;
  char *local_588;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_548;
  Message local_540;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__11;
  size_t iter_3;
  upb_StringView value_3;
  upb_StringView key_3;
  AssertHelper local_4d8;
  Message local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__10;
  Message local_4a8;
  int32_t local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_6;
  Message local_480;
  void *local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_5;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_418;
  Message local_410;
  bool local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__9;
  size_t iter_2;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *value_2;
  undefined1 local_3d8 [4];
  int32_t key_2;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__8;
  Message local_388;
  double local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_3;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__7;
  size_t iter_1;
  double value_1;
  undefined1 local_2e0 [4];
  int32_t key_1;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__6;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_1;
  Message local_268;
  int local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  size_t iter;
  bool value;
  protobuf_test_messages_proto2_TestAllTypesProto2 *ppStack_1f0;
  int32_t key;
  protobuf_test_messages_proto2_TestAllTypesProto2 *clone;
  upb_Arena *arena;
  AssertHelper local_1c0;
  Message local_1b8;
  upb_StringView local_1b0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__3;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *nested2;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *nested;
  AssertHelper local_110;
  Message local_108;
  upb_StringView local_100;
  upb_StringView local_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58 [3];
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg;
  upb_Arena *source_arena;
  GeneratedCode_DeepCloneMessageMapField_Test *this_local;
  
  arena_00 = upb_Arena_New();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )protobuf_test_messages_proto2_TestAllTypesProto2_new(arena_00);
  local_31 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set
                       ((protobuf_test_messages_proto2_TestAllTypesProto2 *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,0,true,arena_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,
               (AssertionResult *)
               "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set( msg, 0, true, source_arena)"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_91 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set
                         ((protobuf_test_messages_proto2_TestAllTypesProto2 *)
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,0xc,1200.5,arena_00);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,
                 (AssertionResult *)
                 "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set( msg, 12, 1200.5, source_arena)"
                 ,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                 ,0xaf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    uVar1 = gtest_ar_.message_;
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_f0 = upb_StringView_FromString("key1");
      local_100 = upb_StringView_FromString("value1");
      expected_predicate_value = arena_00;
      local_d9 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set
                           ((protobuf_test_messages_proto2_TestAllTypesProto2 *)
                            uVar1._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,local_f0,local_100,arena_00);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_d8,&local_d9,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar2) {
        testing::Message::Message(&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&nested,(internal *)local_d8,
                   (AssertionResult *)
                   "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set( msg, upb_StringView_FromString(\"key1\"), upb_StringView_FromString(\"value1\"), source_arena)"
                   ,"false","true",(char *)expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                   ,0xb3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&nested);
        testing::Message::~Message(&local_108);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        msg_00 = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena_00);
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(msg_00,0x7b);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena_00);
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a
                  ((protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)
                   gtest_ar__3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,0x75bcd15);
        local_151 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set
                              ((protobuf_test_messages_proto2_TestAllTypesProto2 *)
                               gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,1,
                               (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)
                               gtest_ar__3.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,arena_00);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_150,&local_151,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        if (!bVar2) {
          testing::Message::Message(&local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_150,
                     (AssertionResult *)
                     "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set( msg, 1, nested2, source_arena)"
                     ,"false","true",(char *)expected_predicate_value);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                     ,0xc0,pcVar3);
          testing::internal::AssertHelper::operator=(&local_168,&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_160);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        uVar1 = gtest_ar_.message_;
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_1b0 = upb_StringView_FromString("nestedkey1");
          local_199 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set
                                ((protobuf_test_messages_proto2_TestAllTypesProto2 *)
                                 uVar1._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,local_1b0,msg_00,arena_00);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_198,&local_199,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
          if (!bVar2) {
            testing::Message::Message(&local_1b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&arena,(internal *)local_198,
                       (AssertionResult *)
                       "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set( msg, upb_StringView_FromString(\"nestedkey1\"), nested, source_arena)"
                       ,"false","true",(char *)expected_predicate_value);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                       ,0xc3,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
            testing::internal::AssertHelper::~AssertHelper(&local_1c0);
            std::__cxx11::string::~string((string *)&arena);
            testing::Message::~Message(&local_1b8);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            clone = (protobuf_test_messages_proto2_TestAllTypesProto2 *)upb_Arena_New();
            ppStack_1f0 = (protobuf_test_messages_proto2_TestAllTypesProto2 *)
                          upb_Message_DeepClone
                                    ((upb_Message *)
                                     gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl,
                                     &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
                                     (upb_Arena *)clone);
            protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(msg_00,0);
            upb_Arena_Free(arena_00);
            gtest_ar__5.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0xffffffffffffffff;
            local_211 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next
                                  (ppStack_1f0,(int32_t *)((long)&iter + 4),
                                   (bool *)((long)&iter + 3),(size_t *)&gtest_ar__5.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_210,&local_211,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
            if (!bVar2) {
              testing::Message::Message(&local_220);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar.message_,(internal *)local_210,
                         (AssertionResult *)
                         "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next( clone, &key, &value, &iter)"
                         ,"false","true",(char *)expected_predicate_value);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_228,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                         ,0xd6,pcVar3);
              testing::internal::AssertHelper::operator=(&local_228,&local_220);
              testing::internal::AssertHelper::~AssertHelper(&local_228);
              std::__cxx11::string::~string((string *)&gtest_ar.message_);
              testing::Message::~Message(&local_220);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_25c = 0;
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_258,"key","0",(int *)((long)&iter + 4),&local_25c);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
              if (!bVar2) {
                testing::Message::Message(&local_268);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xd7,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_1.message_,&local_268);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_)
                ;
                testing::Message::~Message(&local_268);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
              local_281 = true;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_280,"value","true",(bool *)((long)&iter + 3),&local_281);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
              if (!bVar2) {
                testing::Message::Message(&local_290);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xd8,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__6.message_,&local_290);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_290);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              bVar2 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next
                                (ppStack_1f0,(int32_t *)((long)&iter + 4),(bool *)((long)&iter + 3),
                                 (size_t *)&gtest_ar__5.message_);
              local_2a9 = (bool)((bVar2 ^ 0xffU) & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
              if (!bVar2) {
                testing::Message::Message(&local_2b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_2e0,(internal *)local_2a8,
                           (AssertionResult *)
                           "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next( clone, &key, &value, &iter)"
                           ,"true","false",(char *)expected_predicate_value);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2c0,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                           ,0xdc,pcVar3);
                testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                std::__cxx11::string::~string((string *)local_2e0);
                testing::Message::~Message(&local_2b8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                gtest_ar__7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0xffffffffffffffff;
                local_309 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next
                                      (ppStack_1f0,(int32_t *)((long)&value_1 + 4),(double *)&iter_1
                                       ,(size_t *)&gtest_ar__7.message_);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_308,&local_309,(type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_308);
                if (!bVar2) {
                  testing::Message::Message(&local_318);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_2.message_,(internal *)local_308,
                             (AssertionResult *)
                             "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next( clone, &key, &value, &iter)"
                             ,"false","true",(char *)expected_predicate_value);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_320,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                             ,0xe7,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_320,&local_318);
                  testing::internal::AssertHelper::~AssertHelper(&local_320);
                  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_318);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_354 = 0xc;
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_350,"key","12",(int *)((long)&value_1 + 4),&local_354
                            );
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_350);
                  if (!bVar2) {
                    testing::Message::Message(&local_360);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0xe8,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3.message_,&local_360);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_3.message_);
                    testing::Message::~Message(&local_360);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                  local_380 = 1200.5;
                  testing::internal::EqHelper::Compare<double,_double,_nullptr>
                            ((EqHelper *)local_378,"value","1200.5",(double *)&iter_1,&local_380);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_378);
                  if (!bVar2) {
                    testing::Message::Message(&local_388);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0xe9,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_388);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_388);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                  bVar2 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next
                                    (ppStack_1f0,(int32_t *)((long)&value_1 + 4),(double *)&iter_1,
                                     (size_t *)&gtest_ar__7.message_);
                  local_3a1 = (bool)((bVar2 ^ 0xffU) & 1);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3a0);
                  if (!bVar2) {
                    testing::Message::Message(&local_3b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_3d8,(internal *)local_3a0,
                               (AssertionResult *)
                               "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next( clone, &key, &value, &iter)"
                               ,"true","false",(char *)expected_predicate_value);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                               ,0xed,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
                    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                    std::__cxx11::string::~string((string *)local_3d8);
                    testing::Message::~Message(&local_3b0);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    gtest_ar__9.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0xffffffffffffffff;
                    local_401 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next
                                          (ppStack_1f0,(int32_t *)((long)&value_2 + 4),
                                           (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                            **)&iter_2,(size_t *)&gtest_ar__9.message_);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_400,&local_401,(type *)0x0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_400);
                    if (!bVar2) {
                      testing::Message::Message(&local_410);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_4.message_,(internal *)local_400,
                                 (AssertionResult *)
                                 "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next( clone, &key, &value, &iter)"
                                 ,"false","true",(char *)expected_predicate_value);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_418,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                 ,0xf7,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_418,&local_410);
                      testing::internal::AssertHelper::~AssertHelper(&local_418);
                      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                      testing::Message::~Message(&local_410);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_44c = 1;
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_448,"key","1",(int *)((long)&value_2 + 4),
                                 &local_44c);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_448);
                      if (!bVar2) {
                        testing::Message::Message(&local_458);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_448);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                   ,0xf8,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_5.message_,&local_458);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_5.message_);
                        testing::Message::~Message(&local_458);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
                      local_478 = (void *)0x0;
                      testing::internal::
                      CmpHelperNE<protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_const*,decltype(nullptr)>
                                ((internal *)local_470,"value","nullptr",
                                 (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **)
                                 &iter_2,&local_478);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_470);
                      if (!bVar2) {
                        testing::Message::Message(&local_480);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_470);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                   ,0xf9,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_6.message_,&local_480);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_6.message_);
                        testing::Message::~Message(&local_480);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_49c = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a
                                              ((protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                                *)iter_2);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_498,
                                   "protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value)"
                                   ,"kTestNestedInt64",&local_49c,
                                   &::(anonymous_namespace)::kTestNestedInt64);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_498);
                        if (!bVar2) {
                          testing::Message::Message(&local_4a8);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_498);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                     ,0xfc,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__10.message_,&local_4a8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__10.message_);
                          testing::Message::~Message(&local_4a8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
                        bVar2 = protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next
                                          (ppStack_1f0,(int32_t *)((long)&value_2 + 4),
                                           (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                            **)&iter_2,(size_t *)&gtest_ar__9.message_);
                        local_4c1 = (bool)((bVar2 ^ 0xffU) & 1);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4c0);
                        if (!bVar2) {
                          testing::Message::Message(&local_4d0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&key_3.size,(internal *)local_4c0,
                                     (AssertionResult *)
                                     "protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next( clone, &key, &value, &iter)"
                                     ,"true","false",(char *)expected_predicate_value);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4d8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                     ,0xff,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4d8);
                          std::__cxx11::string::~string((string *)&key_3.size);
                          testing::Message::~Message(&local_4d0);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          gtest_ar__11.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0xffffffffffffffff;
                          local_531 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next
                                                (ppStack_1f0,(upb_StringView *)&value_3.size,
                                                 (upb_StringView *)&iter_3,
                                                 (size_t *)&gtest_ar__11.message_);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_530,&local_531,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_530);
                          if (!bVar2) {
                            testing::Message::Message(&local_540);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__12.message_,(internal *)local_530,
                                       (AssertionResult *)
                                       "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next( clone, &key, &value, &iter)"
                                       ,"false","true",(char *)expected_predicate_value);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_548,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                       ,0x10a,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_548,&local_540);
                            testing::internal::AssertHelper::~AssertHelper(&local_548);
                            std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                            testing::Message::~Message(&local_540);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_590 = (char *)value_3.size;
                            local_588 = key_3.data;
                            local_5a0 = upb_StringView_FromString("key1");
                            a_01.size = (size_t)local_588;
                            a_01.data = local_590;
                            local_579 = ::upb_StringView_IsEqual(a_01,local_5a0);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_578,&local_579,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_578);
                            if (!bVar2) {
                              testing::Message::Message(&local_5a8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__13.message_,(internal *)local_578,
                                         (AssertionResult *)
                                         "upb_StringView_IsEqual(key, upb_StringView_FromString(\"key1\"))"
                                         ,"false","true",(char *)expected_predicate_value);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_5b0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                         ,0x10b,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
                              testing::internal::AssertHelper::~AssertHelper(&local_5b0);
                              std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                              testing::Message::~Message(&local_5a8);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_578)
                            ;
                            local_5f8 = (char *)iter_3;
                            local_5f0 = value_3.data;
                            local_608 = upb_StringView_FromString("value1");
                            a_00.size = (size_t)local_5f0;
                            a_00.data = local_5f8;
                            local_5e1 = ::upb_StringView_IsEqual(a_00,local_608);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_5e0,&local_5e1,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_5e0);
                            if (!bVar2) {
                              testing::Message::Message(&local_610);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&key_4.size,(internal *)local_5e0,
                                         (AssertionResult *)
                                         "upb_StringView_IsEqual(value, upb_StringView_FromString(\"value1\"))"
                                         ,"false","true",(char *)expected_predicate_value);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_618,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                         ,0x10d,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_618,&local_610);
                              testing::internal::AssertHelper::~AssertHelper(&local_618);
                              std::__cxx11::string::~string((string *)&key_4.size);
                              testing::Message::~Message(&local_610);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0)
                            ;
                            gtest_ar__14.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )0xffffffffffffffff;
                            local_669 = protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next
                                                  (ppStack_1f0,(upb_StringView *)&value_4,
                                                   (
                                                  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                                  **)&iter_4,(size_t *)&gtest_ar__14.message_);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_668,&local_669,(type *)0x0);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_668);
                            if (!bVar2) {
                              testing::Message::Message(&local_678);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__15.message_,(internal *)local_668,
                                         (AssertionResult *)
                                         "protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next( clone, &key, &value, &iter)"
                                         ,"false","true",(char *)expected_predicate_value);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_680,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                         ,0x117,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_680,&local_678);
                              testing::internal::AssertHelper::~AssertHelper(&local_680);
                              std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                              testing::Message::~Message(&local_678);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_668)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_6c8 = value_4;
                              local_6c0 = key_4.data;
                              local_6d8 = upb_StringView_FromString("nestedkey1");
                              a.size = (size_t)local_6c0;
                              a.data = (char *)local_6c8;
                              local_6b1 = ::upb_StringView_IsEqual(a,local_6d8);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_6b0);
                              if (!bVar2) {
                                testing::Message::Message(&local_6e0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_7.message_,(internal *)local_6b0,
                                           (AssertionResult *)
                                           "upb_StringView_IsEqual(key, upb_StringView_FromString(\"nestedkey1\"))"
                                           ,"false","true",(char *)expected_predicate_value);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_6e8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                           ,0x119,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
                                testing::internal::AssertHelper::~AssertHelper(&local_6e8);
                                std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                                testing::Message::~Message(&local_6e0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_6b0);
                              local_720 = (void *)0x0;
                              testing::internal::
                              CmpHelperNE<protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_const*,decltype(nullptr)>
                                        ((internal *)local_718,"value","nullptr",
                                         (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                          **)&iter_4,&local_720);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_718);
                              if (!bVar2) {
                                testing::Message::Message(&local_728);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_718);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                           ,0x11a,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_8.message_,&local_728);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_8.message_);
                                testing::Message::~Message(&local_728);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_718);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_744 = protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a
                                                      ((
                                                  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage
                                                  *)iter_4);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_740,
                                           "protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value)"
                                           ,"kTestNestedInt32",&local_744,
                                           &::(anonymous_namespace)::kTestNestedInt32);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_740);
                                if (!bVar2) {
                                  testing::Message::Message(&local_750);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_740);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_758,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy_test.cc"
                                             ,0x11d,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_758,&local_750);
                                  testing::internal::AssertHelper::~AssertHelper(&local_758);
                                  testing::Message::~Message(&local_750);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_740);
                                upb_Arena_Free((upb_Arena *)clone);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(GeneratedCode, DeepCloneMessageMapField) {
  upb_Arena* source_arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(source_arena);
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set(
          msg, 0, true, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_set(
          msg, 12, 1200.5, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set(
          msg, upb_StringView_FromString("key1"),
          upb_StringView_FromString("value1"), source_arena));
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* nested =
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(
          source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(
      nested, kTestNestedInt32);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* nested2 =
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(
          source_arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(
      nested2, kTestNestedInt64);
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set(
          msg, 1, nested2, source_arena));
  ASSERT_TRUE(
      protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set(
          msg, upb_StringView_FromString("nestedkey1"), nested, source_arena));

  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* clone =
      (protobuf_test_messages_proto2_TestAllTypesProto2*)upb_Message_DeepClone(
          UPB_UPCAST(msg),
          &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
          arena);
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_set_a(nested,
                                                                       0);
  upb_Arena_Free(source_arena);
  // Test map<int32, bool>.
  {
    int32_t key;
    bool value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 0);
    EXPECT_EQ(value, true);

    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_next(
            clone, &key, &value, &iter));
  }

  // Test map<int32, double>.
  {
    int32_t key;
    double value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 12);
    EXPECT_EQ(value, 1200.5);

    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_double_next(
            clone, &key, &value, &iter));
  }

  // Test map<int32, NestedMessage>.
  {
    int32_t key;
    const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* value;
    size_t iter = kUpb_Map_Begin;
    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next(
            clone, &key, &value, &iter));
    EXPECT_EQ(key, 1);
    ASSERT_NE(value, nullptr);
    EXPECT_EQ(
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value),
        kTestNestedInt64);
    ASSERT_FALSE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next(
            clone, &key, &value, &iter));
  }

  // Test map<string, string>.
  {
    upb_StringView key;
    upb_StringView value;
    size_t iter = kUpb_Map_Begin;

    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_next(
            clone, &key, &value, &iter));
    EXPECT_TRUE(upb_StringView_IsEqual(key, upb_StringView_FromString("key1")));
    EXPECT_TRUE(
        upb_StringView_IsEqual(value, upb_StringView_FromString("value1")));
  }

  // Test map<string, NestedMessage>.
  {
    upb_StringView key;
    const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* value;
    size_t iter = kUpb_Map_Begin;
    ASSERT_TRUE(
        protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next(
            clone, &key, &value, &iter));
    EXPECT_TRUE(
        upb_StringView_IsEqual(key, upb_StringView_FromString("nestedkey1")));
    ASSERT_NE(value, nullptr);
    EXPECT_EQ(
        protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(value),
        kTestNestedInt32);
  }

  upb_Arena_Free(arena);
}